

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  byte *pbVar3;
  CharPtr pcVar4;
  byte bVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  char prefix [4];
  undefined4 local_58;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  size_t __n_00;
  
  uVar1 = spec._20_4_;
  uVar8 = (ulong)(uint)value;
  local_58 = 0;
  if (value < 0) {
    local_58 = 0x2d;
    uVar8 = (ulong)(uint)-value;
LAB_001234a9:
    uVar10 = 1;
  }
  else {
    uVar10 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar5 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar5 = 0x20;
      }
      local_58 = (uint)bVar5;
      goto LAB_001234a9;
    }
  }
  uVar11 = (uint)uVar8;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0012379f;
      if (spec.type_ != 'B') goto code_r0x0012390a;
    }
    else {
      if (spec.type_ == 'X') {
LAB_0012372e:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar14 = (ulong)uVar10;
          *(undefined1 *)((long)&local_58 + uVar14) = 0x30;
          uVar10 = uVar10 | 2;
          *(char *)((long)&local_58 + uVar14 + 1) = spec.type_;
        }
        uVar11 = 0;
        uVar14 = uVar8;
        do {
          uVar11 = uVar11 + 1;
          uVar12 = (uint)uVar14;
          uVar14 = uVar14 >> 4;
        } while (0xf < uVar12);
        pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar11,&spec,(char *)&local_58,uVar10);
        pcVar7 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar7 = "0123456789abcdef";
        }
        do {
          uVar10 = (uint)uVar8;
          *pcVar4 = pcVar7[uVar10 & 0xf];
          pcVar4 = pcVar4 + -1;
          uVar8 = uVar8 >> 4;
        } while (0xf < uVar10);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0012390a;
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      uVar14 = (ulong)uVar10;
      *(undefined1 *)((long)&local_58 + uVar14) = 0x30;
      uVar10 = uVar10 | 2;
      *(char *)((long)&local_58 + uVar14 + 1) = spec.type_;
    }
    uVar11 = 0;
    uVar14 = uVar8;
    do {
      uVar11 = uVar11 + 1;
      uVar12 = (uint)uVar14;
      uVar14 = uVar14 >> 1;
    } while (1 < uVar12);
    pbVar3 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar11,&spec,(char *)&local_58,uVar10)
    ;
    do {
      uVar10 = (uint)uVar8;
      *pbVar3 = (byte)uVar8 & 1 | 0x30;
      pbVar3 = pbVar3 + -1;
      uVar8 = uVar8 >> 1;
    } while (1 < uVar10);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar14 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          *(undefined1 *)((long)&local_58 + uVar14) = 0x30;
        }
        uVar11 = 0;
        uVar14 = uVar8;
        do {
          uVar11 = uVar11 + 1;
          uVar12 = (uint)uVar14;
          uVar14 = uVar14 >> 3;
        } while (7 < uVar12);
        pbVar3 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar11,&spec,(char *)&local_58,uVar10);
        do {
          uVar10 = (uint)uVar8;
          *pbVar3 = (byte)uVar8 & 7 | 0x30;
          pbVar3 = pbVar3 + -1;
          uVar8 = uVar8 >> 3;
        } while (7 < uVar10);
        return;
      }
      if (spec.type_ == 'x') goto LAB_0012372e;
code_r0x0012390a:
      internal::report_unknown_type
                ((char)((uint)in_stack_ffffffffffffffac >> 0x18),in_stack_ffffffffffffffb0);
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        uVar12 = 0x1f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uVar12 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
        plVar2 = localeconv();
        pcVar7 = plVar2->thousands_sep;
        __n = strlen(pcVar7);
        uVar12 = uVar12 - (uVar11 < *(uint *)(internal::BasicData<void>::POWERS_OF_10_32 +
                                             (ulong)uVar12 * 4));
        pcVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar12 + (int)__n * (uVar12 / 3) + 1,&spec,(char *)&local_58,uVar10
                           );
        pcVar4 = pcVar4 + 1;
        if (uVar11 < 100) {
          bVar17 = false;
        }
        else {
          lVar6 = -__n;
          iVar9 = -1;
          uVar16 = 1;
          iVar13 = -2;
          uVar14 = 2;
          __n_00 = __n;
          do {
            uVar10 = (uint)uVar8;
            uVar11 = (uint)(uVar8 / 100);
            uVar15 = (ulong)((uVar10 + (int)(uVar8 / 100) * -100) * 2);
            pcVar4[-1] = internal::BasicData<void>::DIGITS[uVar15 + 1];
            pcVar4 = pcVar4 + -1;
            if (((int)(uVar16 / 3) * 3 + iVar9 == 0) && (pcVar4 = pcVar4 + lVar6, __n != 0)) {
              __n = __n_00;
              memmove(pcVar4,pcVar7,__n_00);
              __n_00 = __n;
            }
            pcVar4[-1] = internal::BasicData<void>::DIGITS[uVar15];
            pcVar4 = pcVar4 + -1;
            if (((int)(uVar14 / 3) * 3 + iVar13 == 0) && (pcVar4 = pcVar4 + lVar6, __n != 0)) {
              __n = __n_00;
              memmove(pcVar4,pcVar7,__n_00);
              __n_00 = __n;
            }
            iVar9 = iVar9 + -2;
            uVar12 = (int)uVar16 + 2;
            uVar16 = (ulong)uVar12;
            iVar13 = iVar13 + -2;
            uVar14 = (ulong)((int)uVar14 + 2);
            uVar8 = uVar8 / 100;
          } while (9999 < uVar10);
          bVar17 = iVar9 + (uVar12 / 3) * 3 == 0;
        }
        if (uVar11 < 10) {
          pcVar4[-1] = (byte)uVar11 | 0x30;
          return;
        }
        pcVar4[-1] = internal::BasicData<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1];
        pcVar4 = pcVar4 + -1;
        if ((bVar17) && (pcVar4 = pcVar4 + -__n, __n != 0)) {
          memmove(pcVar4,pcVar7,__n);
        }
        pcVar4[-1] = internal::BasicData<void>::DIGITS[(ulong)uVar11 * 2];
        return;
      }
      goto code_r0x0012390a;
    }
LAB_0012379f:
    uVar12 = 0x1f;
    if ((uVar11 | 1) != 0) {
      for (; (uVar11 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar12 = (uVar12 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar12 - (uVar11 < *(uint *)(internal::BasicData<void>::
                                                           POWERS_OF_10_32 + (ulong)uVar12 * 4))) +
                             1,&spec,(char *)&local_58,uVar10);
    pcVar4 = pcVar4 + 1;
    if (99 < uVar11) {
      do {
        uVar10 = (uint)uVar8;
        uVar11 = (uint)(uVar8 / 100);
        uVar8 = uVar8 / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (internal::BasicData<void>::DIGITS + (ulong)(uVar10 + (int)uVar8 * -100) * 2);
        pcVar4 = pcVar4 + -2;
      } while (9999 < uVar10);
    }
    if (uVar11 < 10) {
      pcVar4[-1] = (byte)uVar11 | 0x30;
    }
    else {
      pcVar4[-1] = internal::BasicData<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1];
      pcVar4[-2] = internal::BasicData<void>::DIGITS[(ulong)uVar11 * 2];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}